

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

Violation __thiscall
mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>::ComputeViolation<mp::VarInfoRecomp>
          (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_> *this,VarInfoRecomp *x,bool logical)

{
  Violation VVar1;
  bool bVar2;
  double *pdVar3;
  byte in_DL;
  long in_RDI;
  longdouble in_ST0;
  double dVar4;
  double bd;
  VarInfoRecomp *in_stack_00000088;
  LinTerms *in_stack_00000090;
  double in_stack_ffffffffffffff98;
  double dVar5;
  AlgConRhs<2> *in_stack_ffffffffffffffa0;
  double local_40;
  double local_38;
  double local_30;
  byte local_21;
  double local_10;
  double local_8;
  
  local_21 = in_DL & 1;
  LinTerms::ComputeValue<mp::VarInfoRecomp>(in_stack_00000090,in_stack_00000088);
  local_30 = (double)in_ST0;
  if ((local_21 & 1) == 0) {
    dVar4 = AlgConRhs<2>::lb((AlgConRhs<2> *)0x25acba);
    dVar5 = local_30;
    if (dVar4 <= local_30) {
      dVar4 = AlgConRhs<2>::ub((AlgConRhs<2> *)(in_RDI + 0x98));
      if (dVar5 <= dVar4) {
        local_38 = AlgConRhs<2>::lb((AlgConRhs<2> *)0x25ad84);
        local_38 = local_38 - local_30;
        dVar5 = local_30;
        local_40 = AlgConRhs<2>::ub((AlgConRhs<2> *)(in_RDI + 0x98));
        local_40 = dVar5 - local_40;
        pdVar3 = std::max<double>(&local_38,&local_40);
        local_10 = *pdVar3;
        local_8 = 0.0;
      }
      else {
        dVar5 = local_30;
        local_10 = AlgConRhs<2>::ub((AlgConRhs<2> *)(in_RDI + 0x98));
        local_10 = dVar5 - local_10;
        local_8 = AlgConRhs<2>::ub((AlgConRhs<2> *)(in_RDI + 0x98));
      }
    }
    else {
      local_10 = AlgConRhs<2>::lb((AlgConRhs<2> *)0x25acd3);
      local_10 = local_10 - local_30;
      local_8 = AlgConRhs<2>::lb((AlgConRhs<2> *)0x25acf0);
    }
  }
  else {
    bVar2 = AlgConRhs<2>::is_valid(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_10 = (double)!bVar2;
    local_8 = 1.0;
  }
  VVar1.valX_ = local_8;
  VVar1.viol_ = local_10;
  return VVar1;
}

Assistant:

Violation
  ComputeViolation(const VarInfo& x, bool logical=false) const {
    double bd = Body::ComputeValue(x);
    if (!logical) {
      if (RhsOrRange::lb() > bd)
        return {RhsOrRange::lb() - bd, RhsOrRange::lb()};
      if (bd > RhsOrRange::ub())
        return {bd - RhsOrRange::ub(), RhsOrRange::ub()};
      return
      {std::max( // negative. Same for strict cmp?
                 RhsOrRange::lb() - bd, bd - RhsOrRange::ub()),
            0.0};
    }
    return {double(!RhsOrRange::is_valid(bd)), 1.0};
  }